

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

ExtPubkey * __thiscall
cfd::core::KeyData::GetExtPubkey(ExtPubkey *__return_storage_ptr__,KeyData *this)

{
  ExtPubkey::ExtPubkey(__return_storage_ptr__,&this->extpubkey_);
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey KeyData::GetExtPubkey() const { return extpubkey_; }